

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_vote_resp(raft_server *this,resp_msg *resp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int32 iVar6;
  element_type *peVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  raft_server *this_00;
  resp_msg *in_RSI;
  long in_RDI;
  raft_server *in_stack_00000120;
  int32 election_quorum_size;
  raft_server *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe68;
  srv_role _role;
  raft_server *in_stack_fffffffffffffe80;
  char *local_168;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [36];
  int local_84;
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  resp_msg *local_10;
  
  _role = (srv_role)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  if ((*(byte *)(in_RDI + 0xe8) & 1) == 0) {
    local_10 = in_RSI;
    uVar8 = msg_base::get_term(&in_RSI->super_msg_base);
    std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x4a9f28);
    uVar9 = srv_state::get_term((srv_state *)0x4a9f30);
    if (uVar8 == uVar9) {
      *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
      bVar3 = resp_msg::get_accepted(local_10);
      if (bVar3) {
        *(int *)(in_RDI + 0x8c) = *(int *)(in_RDI + 0x8c) + 1;
      }
      iVar4 = *(int *)(in_RDI + 0x88);
      iVar6 = get_num_voting_members(in_stack_fffffffffffffe80);
      if (iVar6 <= iVar4) {
        *(undefined1 *)(in_RDI + 0xe8) = 1;
      }
      iVar6 = get_quorum_for_election(in_stack_fffffffffffffe58);
      local_84 = iVar6 + 1;
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4aa19a);
        iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
        if (3 < iVar4) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4aa1c0);
          uVar5 = msg_base::get_src(&local_10->super_msg_base);
          bVar3 = resp_msg::get_accepted(local_10);
          if (bVar3) {
            local_168 = "NO";
          }
          else {
            local_168 = "XX";
          }
          local_168 = local_168 + 1;
          uVar8 = msg_base::get_term(&local_10->super_msg_base);
          std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x4aa238);
          srv_role_to_string_abi_cxx11_((srv_role)((ulong)local_168 >> 0x20));
          this_00 = (raft_server *)std::__cxx11::string::c_str();
          uVar1 = *(undefined4 *)(in_RDI + 0x88);
          uVar2 = *(undefined4 *)(in_RDI + 0x8c);
          iVar6 = get_num_voting_members(this_00);
          msg_if_given_abi_cxx11_
                    ((char *)local_a8,
                     "[VOTE RESP] peer %d (%s), resp term %lu, my role %s, granted %d, responded %d, num voting members %d, quorum %d\n"
                     ,(ulong)uVar5,local_168,uVar8,this_00,uVar2,uVar1,iVar6,local_84);
          (**(code **)(*(long *)peVar7 + 0x40))
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_vote_resp",0x181,local_a8);
          std::__cxx11::string::~string(local_a8);
          std::__cxx11::string::~string(local_c8);
        }
      }
      if (local_84 <= *(int *)(in_RDI + 0x8c)) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4aa3b7);
          iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
          if (3 < iVar4) {
            peVar7 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4aa3dd);
            std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4aa3f6);
            uVar8 = srv_state::get_term((srv_state *)0x4aa3fe);
            msg_if_given_abi_cxx11_
                      ((char *)local_e8,"Server is elected as leader for term %lu",uVar8);
            (**(code **)(*(long *)peVar7 + 0x40))
                      (peVar7,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_vote_resp",0x184,local_e8);
            std::__cxx11::string::~string(local_e8);
          }
        }
        *(undefined1 *)(in_RDI + 0xe8) = 1;
        become_leader(in_stack_00000120);
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4aa4c4);
          iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
          if (3 < iVar4) {
            peVar7 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x4aa4ea);
            std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x4aa503);
            uVar8 = srv_state::get_term((srv_state *)0x4aa50b);
            msg_if_given_abi_cxx11_((char *)local_108,"  === LEADER (term %lu) ===\n",uVar8);
            (**(code **)(*(long *)peVar7 + 0x40))
                      (peVar7,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                       ,"handle_vote_resp",0x187,local_108);
            std::__cxx11::string::~string(local_108);
          }
        }
      }
    }
    else {
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar3) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4a9f75);
        iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
        if (3 < iVar4) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4a9f9b);
          uVar5 = msg_base::get_src(&local_10->super_msg_base);
          std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x4a9fcb);
          srv_role_to_string_abi_cxx11_(_role);
          uVar10 = std::__cxx11::string::c_str();
          uVar8 = msg_base::get_term(&local_10->super_msg_base);
          msg_if_given_abi_cxx11_
                    ((char *)local_60,
                     "[VOTE RESP] from peer %d, my role %s, but different resp term %lu. ignore it."
                     ,(ulong)uVar5,uVar10,uVar8);
          (**(code **)(*(long *)peVar7 + 0x40))
                    (peVar7,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_vote_resp",0x16c,local_60);
          std::__cxx11::string::~string(local_60);
          std::__cxx11::string::~string(local_80);
        }
      }
    }
  }
  else {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar3) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4a9e45);
      iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
      if (3 < iVar4) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4a9e6b);
        msg_if_given_abi_cxx11_
                  ((char *)local_30,
                   "Election completed, will ignore the voting result from this server");
        (**(code **)(*(long *)peVar7 + 0x40))
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_vote_resp",0x164,local_30);
        std::__cxx11::string::~string(local_30);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_vote_resp(resp_msg& resp) {
    if (election_completed_) {
        p_in("Election completed, will ignore the voting result from this server");
        return;
    }

    if (resp.get_term() != state_->get_term()) {
        // Vote response for other term. Should ignore it.
        p_in("[VOTE RESP] from peer %d, my role %s, "
             "but different resp term %" PRIu64 ". ignore it.",
             resp.get_src(), srv_role_to_string(role_).c_str(), resp.get_term());
        return;
    }
    votes_responded_ += 1;

    if (resp.get_accepted()) {
        votes_granted_ += 1;
    }

    if (votes_responded_ >= get_num_voting_members()) {
        election_completed_ = true;
    }

    int32 election_quorum_size = get_quorum_for_election() + 1;

    p_in("[VOTE RESP] peer %d (%s), resp term %" PRIu64 ", my role %s, "
         "granted %d, responded %d, "
         "num voting members %d, quorum %d\n",
         resp.get_src(), (resp.get_accepted()) ? "O" : "X", resp.get_term(),
         srv_role_to_string(role_).c_str(),
         (int)votes_granted_, (int)votes_responded_,
         get_num_voting_members(), election_quorum_size);

    if (votes_granted_ >= election_quorum_size) {
        p_in("Server is elected as leader for term %" PRIu64, state_->get_term());
        election_completed_ = true;
        become_leader();
        p_in("  === LEADER (term %" PRIu64 ") ===\n", state_->get_term());
    }
}